

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

bool choc::html::HTMLElement::isCharLegal(uint32_t c)

{
  size_type sVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  bVar2 = true;
  if ((9 < c - 0x30) && (0x19 < (c & 0xffffffdf) - 0x41)) {
    if (0x7e < c) {
      return false;
    }
    local_10._M_len = 0x1a;
    local_10._M_str = " .,;:-()_+=?!$#@[]/|*%~{}\\";
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_10,(char)c,0);
    bVar2 = sVar1 != 0xffffffffffffffff;
  }
  return bVar2;
}

Assistant:

static bool isCharLegal (uint32_t c)
    {
        return (c >= 'a' && c <= 'z')
            || (c >= 'A' && c <= 'Z')
            || (c >= '0' && c <= '9')
            || (c < 127 && std::string_view (" .,;:-()_+=?!$#@[]/|*%~{}\\").find ((char) c) != std::string_view::npos);
    }